

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O2

void __thiscall
gmath::DMatrix<double>::DMatrix<double,3,3>(DMatrix<double> *this,SMatrix<double,_3,_3> *a)

{
  double *pdVar1;
  int k;
  long lVar2;
  int i;
  long lVar3;
  
  this->nrows = 3;
  this->ncols = 3;
  this->n = 9;
  pdVar1 = (double *)operator_new__(0x48);
  this->v = pdVar1;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      pdVar1[lVar3] = (*(double (*) [3])*(double (*) [3])a)[lVar3];
    }
    pdVar1 = pdVar1 + 3;
    a = (SMatrix<double,_3,_3> *)((long)a + 0x18);
  }
  return;
}

Assistant:

DMatrix(const SMatrix<S, r, c> &a)
    {
      nrows=r;
      ncols=c;
      n=r*c;
      v=new T[n];

      for (int k=0; k<r; k++)
        for (int i=0; i<c; i++)
        {
          v[k*c+i]=a(k, i);
        }
    }